

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

ON_Interval __thiscall ON_PolyCurve::SegmentDomain(ON_PolyCurve *this,int segment_index)

{
  ON_Interval *pOVar1;
  ON_Interval OVar2;
  ON_Interval local_28;
  
  ON_Interval::ON_Interval(&local_28);
  pOVar1 = &local_28;
  if ((-1 < segment_index) &&
     (pOVar1 = &local_28, segment_index < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count
     )) {
    pOVar1 = (ON_Interval *)((this->m_t).m_a + (uint)segment_index);
    local_28.m_t[0] = *(double *)pOVar1;
  }
  OVar2.m_t[1] = *(double *)((long)pOVar1 + 8);
  OVar2.m_t[0] = local_28.m_t[0];
  return (ON_Interval)OVar2.m_t;
}

Assistant:

ON_Interval 
ON_PolyCurve::SegmentDomain( int segment_index ) const
{
  ON_Interval domain;
  if ( segment_index >= 0 && segment_index < Count() ) {
    domain.m_t[0] = m_t[segment_index];
    domain.m_t[1] = m_t[segment_index+1];
  }
  return domain;
}